

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O2

bool lzham::generate_huffman_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret)

{
  ushort uVar1;
  void *pvVar2;
  uint i_1;
  int iVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int *piVar12;
  int iVar13;
  uint *puVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  int x [600];
  uint auStack_438 [258];
  
  i_1 = num_syms - 1;
  if (i_1 < 600) {
    uVar21 = 0;
    uVar11 = 0;
    for (uVar4 = 0; uVar20 = (uint)uVar21, num_syms != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = pFreq[uVar4];
      if (uVar1 == 0) {
        pCodesizes[uVar4] = '\0';
      }
      else {
        *(short *)((long)pContext + uVar21 * 8 + 4) = (short)uVar4;
        *(undefined2 *)((long)pContext + uVar21 * 8 + 6) = 0xffff;
        uVar11 = uVar11 + uVar1;
        *(uint *)((long)pContext + uVar21 * 8) = (uint)uVar1;
        uVar21 = (ulong)(uVar20 + 1);
      }
    }
    *total_freq_ret = uVar11;
    if (uVar20 == 1) {
      pCodesizes[*(ushort *)((long)pContext + 4)] = '\x01';
    }
    else {
      memset(x,0,0x800);
      uVar4 = (ulong)(uVar20 & 0xfffffffe);
      puVar14 = (uint *)pContext;
      for (lVar5 = (ulong)(uVar20 & 0xfffffffe) << 3; lVar5 != 0; lVar5 = lVar5 + -0x10) {
        uVar18 = *puVar14;
        uVar10 = puVar14[2];
        x[uVar18 & 0xff] = x[uVar18 & 0xff] + 1;
        piVar12 = (int *)((long)x + (ulong)(uVar18 >> 6 & 0x3fc) + 0x400);
        *piVar12 = *piVar12 + 1;
        x[uVar10 & 0xff] = x[uVar10 & 0xff] + 1;
        piVar12 = (int *)((long)x + (ulong)(uVar10 >> 6 & 0x3fc) + 0x400);
        *piVar12 = *piVar12 + 1;
        puVar14 = puVar14 + 4;
      }
      if ((uVar21 & 1) != 0) {
        uVar18 = *(uint *)((long)pContext + uVar4 * 8);
        x[uVar18 & 0xff] = x[uVar18 & 0xff] + 1;
        piVar12 = (int *)((long)x + (ulong)(uVar18 >> 6 & 0x3fc) + 0x400);
        *piVar12 = *piVar12 + 1;
      }
      piVar12 = x + 1;
      pvVar2 = (void *)((long)pContext + 0x2588);
      for (lVar5 = 0; pvVar6 = pvVar2, lVar5 != (ulong)(x[0x100] != uVar20) + 1; lVar5 = lVar5 + 1)
      {
        uVar18 = 0;
        for (uVar7 = 0; uVar7 < 0x100; uVar7 = uVar7 + 2) {
          auStack_438[uVar7] = uVar18;
          iVar9 = piVar12[uVar7 - 1];
          auStack_438[uVar7 + 1] = uVar18 + iVar9;
          uVar18 = uVar18 + iVar9 + piVar12[uVar7];
        }
        for (lVar8 = 0; (ulong)(uVar20 & 0xfffffffe) << 3 != lVar8; lVar8 = lVar8 + 0x10) {
          uVar18 = *(uint *)((long)pContext + lVar8 + 8);
          uVar10 = uVar18 >> 8;
          uVar19 = *(uint *)((long)pContext + lVar8) >> 8;
          if (lVar5 == 0) {
            uVar10 = uVar18;
            uVar19 = *(uint *)((long)pContext + lVar8);
          }
          uVar19 = uVar19 & 0xff;
          uVar10 = uVar10 & 0xff;
          uVar18 = auStack_438[uVar19];
          if (uVar19 == uVar10) {
            auStack_438[uVar19] = uVar18 + 2;
            *(undefined8 *)((long)pvVar6 + (ulong)uVar18 * 8) =
                 *(undefined8 *)((long)pContext + lVar8);
            uVar19 = uVar18 + 1;
          }
          else {
            auStack_438[uVar19] = uVar18 + 1;
            uVar19 = auStack_438[uVar10];
            auStack_438[uVar10] = uVar19 + 1;
            *(undefined8 *)((long)pvVar6 + (ulong)uVar18 * 8) =
                 *(undefined8 *)((long)pContext + lVar8);
          }
          *(undefined8 *)((long)pvVar6 + (ulong)uVar19 * 8) =
               *(undefined8 *)((long)pContext + lVar8 + 8);
        }
        if ((uVar21 & 1) != 0) {
          uVar10 = *(uint *)((long)pContext + uVar4 * 8) >> ((char)lVar5 * '\b' & 0x1fU) & 0xff;
          uVar18 = auStack_438[uVar10];
          auStack_438[uVar10] = uVar18 + 1;
          *(undefined8 *)((long)pvVar6 + (ulong)uVar18 * 8) =
               *(undefined8 *)((long)pContext + uVar4 * 8);
        }
        piVar12 = piVar12 + 0x100;
        pvVar2 = pContext;
        pContext = pvVar6;
      }
      for (uVar4 = 0; uVar21 != uVar4; uVar4 = uVar4 + 1) {
        x[uVar4] = *(int *)((long)pContext + uVar4 * 8);
      }
      if (uVar20 != 0) {
        x[0] = x[0] + x[1];
        iVar3 = uVar20 - 1;
        iVar9 = 2;
        iVar13 = 0;
        for (lVar5 = 1; lVar5 < iVar3; lVar5 = lVar5 + 1) {
          lVar8 = (long)iVar13;
          if ((iVar9 < (int)uVar20) && (lVar17 = (long)iVar9, x[lVar17] <= x[lVar8])) {
            iVar9 = iVar9 + 1;
            x[lVar5] = x[lVar17];
          }
          else {
            x[lVar5] = x[lVar8];
            iVar13 = iVar13 + 1;
            x[lVar8] = (int)lVar5;
            lVar8 = (long)iVar13;
          }
          if (iVar9 < (int)uVar20) {
            if (lVar8 < lVar5) {
              iVar16 = x[lVar8];
              iVar15 = x[iVar9];
              if (iVar16 < iVar15) goto LAB_0012054d;
            }
            else {
              iVar15 = x[iVar9];
            }
            iVar9 = iVar9 + 1;
            x[lVar5] = x[lVar5] + iVar15;
          }
          else {
            iVar16 = x[lVar8];
LAB_0012054d:
            x[lVar5] = x[lVar5] + iVar16;
            iVar13 = iVar13 + 1;
            x[lVar8] = (int)lVar5;
          }
        }
        uVar4 = (ulong)(uVar20 - 2);
        x[(long)(int)uVar20 + -2] = 0;
        for (uVar20 = uVar20 - 3; -1 < (int)uVar20; uVar20 = uVar20 - 1) {
          x[uVar20] = x[x[uVar20]] + 1;
        }
        iVar13 = 0;
        iVar9 = 1;
        while (iVar9 != 0) {
          uVar18 = (uint)uVar4;
          uVar20 = 0xffffffff;
          if ((int)uVar18 < -1) {
            uVar20 = uVar18;
          }
          for (iVar16 = 0; iVar16 != uVar18 - uVar20; iVar16 = iVar16 + 1) {
            if (x[uVar4] != iVar13) goto LAB_001205d5;
            uVar4 = (ulong)((int)uVar4 - 1);
          }
          uVar4 = (ulong)uVar20;
          iVar16 = uVar18 - uVar20;
LAB_001205d5:
          piVar12 = x + iVar3;
          for (; iVar16 < iVar9; iVar9 = iVar9 + -1) {
            *piVar12 = iVar13;
            iVar3 = iVar3 + -1;
            piVar12 = piVar12 + -1;
          }
          iVar13 = iVar13 + 1;
          iVar9 = iVar16 * 2;
        }
      }
      uVar20 = 0;
      for (uVar4 = 0; uVar21 != uVar4; uVar4 = uVar4 + 1) {
        uVar18 = x[uVar4];
        if (uVar20 < uVar18) {
          uVar20 = uVar18;
        }
        pCodesizes[*(ushort *)((long)pContext + uVar4 * 8 + 4)] = (uint8)uVar18;
      }
      *max_code_size = uVar20;
    }
  }
  return i_1 < 600;
}

Assistant:

bool generate_huffman_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret)
   {
      if ((!num_syms) || (num_syms > cHuffmanMaxSupportedSyms))
         return false;
                  
      huffman_work_tables& state = *static_cast<huffman_work_tables*>(pContext);;
            
      uint max_freq = 0;
      uint total_freq = 0;
      
      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];
         
         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);
            
            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_left = (uint16)i;
            sf.m_right = UINT16_MAX;
            sf.m_freq = freq;
            num_used_syms++;
         }            
      }
      
      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_left] = 1;
         return true;
      }

      sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
      
#if USE_CALCULATE_MINIMUM_REDUNDANCY
      int x[cHuffmanMaxSupportedSyms];
      for (uint i = 0; i < num_used_syms; i++)
         x[i] = syms[i].m_freq;
      
      calculate_minimum_redundancy(x, num_used_syms);
      
      uint max_len = 0;
      for (uint i = 0; i < num_used_syms; i++)
      {
         uint len = x[i];
         max_len = math::maximum(len, max_len);
         pCodesizes[syms[i].m_left] = static_cast<uint8>(len);
      }
      max_code_size = max_len;
#else    
      // Computes Huffman codelengths in linear time. More readable than calculate_minimum_redundancy(), and approximately the same speed, but not in-place.
      
      // Dummy node
      sym_freq& sf = state.syms0[num_used_syms];
      sf.m_left = UINT16_MAX;
      sf.m_right = UINT16_MAX;
      sf.m_freq = UINT_MAX;
      
      uint next_internal_node = num_used_syms + 1;
            
      uint queue_front = 0;
      uint queue_end = 0;
            
      uint next_lowest_sym = 0;
      
      uint num_nodes_remaining = num_used_syms;
      do
      {
         uint left_freq = syms[next_lowest_sym].m_freq;
         uint left_child = next_lowest_sym;
         
         if ((queue_end > queue_front) && (syms[state.queue[queue_front]].m_freq < left_freq))
         {
            left_child = state.queue[queue_front];
            left_freq = syms[left_child].m_freq;
            
            queue_front++;
         }
         else
            next_lowest_sym++;
         
         uint right_freq = syms[next_lowest_sym].m_freq;
         uint right_child = next_lowest_sym;

         if ((queue_end > queue_front) && (syms[state.queue[queue_front]].m_freq < right_freq))
         {
            right_child = state.queue[queue_front];
            right_freq = syms[right_child].m_freq;
            
            queue_front++;
         }
         else
            next_lowest_sym++;
      
         LZHAM_ASSERT(next_internal_node < huffman_work_tables::cMaxInternalNodes);
         
         const uint internal_node_index = next_internal_node;
         next_internal_node++;
         
         syms[internal_node_index].m_freq = left_freq + right_freq;
         syms[internal_node_index].m_left = static_cast<uint16>(left_child);
         syms[internal_node_index].m_right = static_cast<uint16>(right_child);
         
         LZHAM_ASSERT(queue_end < huffman_work_tables::cMaxInternalNodes);
         state.queue[queue_end] = static_cast<uint16>(internal_node_index);
         queue_end++;
                  
         num_nodes_remaining--;
         
      } while (num_nodes_remaining > 1);
      
      LZHAM_ASSERT(next_lowest_sym == num_used_syms);
      LZHAM_ASSERT((queue_end - queue_front) == 1);
      
      uint cur_node_index = state.queue[queue_front];
      
      uint32* pStack = (syms == state.syms0) ? (uint32*)state.syms1 : (uint32*)state.syms0;
      uint32* pStack_top = pStack;

      uint max_level = 0;
      
      for ( ; ; ) 
      {
         uint level = cur_node_index >> 16;
         uint node_index = cur_node_index & 0xFFFF;
         
         uint left_child = syms[node_index].m_left;
         uint right_child = syms[node_index].m_right;
         
         uint next_level = (cur_node_index + 0x10000) & 0xFFFF0000;
                           
         if (left_child < num_used_syms)
         {
            max_level = math::maximum(max_level, level);
            
            pCodesizes[syms[left_child].m_left] = static_cast<uint8>(level + 1);
            
            if (right_child < num_used_syms)
            {
               pCodesizes[syms[right_child].m_left] = static_cast<uint8>(level + 1);
               
               if (pStack == pStack_top) break;
               cur_node_index = *--pStack;
            }
            else
            {
               cur_node_index = next_level | right_child;
            }
         }
         else
         {
            if (right_child < num_used_syms)
            {
               max_level = math::maximum(max_level, level);
               
               pCodesizes[syms[right_child].m_left] = static_cast<uint8>(level + 1);
                              
               cur_node_index = next_level | left_child;
            }
            else
            {
               *pStack++ = next_level | left_child;
                              
               cur_node_index = next_level | right_child;
            }
         }
      }
      
      max_code_size = max_level + 1;
#endif
                  
      return true;
   }